

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void fasttext::averageRowsFast<64u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  int iVar1;
  Register second;
  Register second_00;
  Register first;
  Register first_00;
  bool bVar2;
  real *prVar3;
  int64_t iVar4;
  reference piVar5;
  size_type sVar6;
  real *prVar7;
  ulong uVar8;
  DenseMatrix *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *pvVar9;
  undefined1 auVar10 [16];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var12;
  undefined8 uVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  undefined8 uVar15;
  Vector *pVVar16;
  undefined8 uVar17;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [64];
  undefined8 uVar18;
  uint i_2;
  Register mul;
  uint i_1;
  uint i;
  Register *base;
  const_iterator row;
  Register accum [4];
  uint RegisterCount;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffd88
  ;
  undefined8 in_stack_fffffffffffffd90;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  real in_stack_fffffffffffffda4;
  Vector *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  float in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc0 [16];
  int64_t in_stack_fffffffffffffdd0;
  real *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffdf0;
  uint local_204;
  uint local_1a4;
  uint local_194;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  undefined8 local_180 [34];
  undefined4 local_6c;
  DenseMatrix *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  
  local_6c = 4;
  local_68 = in_RDX;
  local_60 = in_RSI;
  prVar3 = Vector::data((Vector *)0x1a50ef);
  if (((ulong)prVar3 & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 64U]"
                 );
  }
  prVar3 = DenseMatrix::data((DenseMatrix *)0x1a5127);
  if (((ulong)prVar3 & 0x3f) == 0) {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffd98);
    auVar10 = in_ZMM0._0_16_;
    if (bVar2) {
      Vector::zero((Vector *)in_stack_fffffffffffffd98);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(local_60);
      vcvtusi2sd_avx512f(auVar10,sVar6);
      Vector::mul(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    }
    else {
      local_188._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::cbegin(in_stack_fffffffffffffd80);
      prVar3 = DenseMatrix::data((DenseMatrix *)0x1a51d3);
      iVar4 = DenseMatrix::cols(local_68);
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_188);
      iVar1 = *piVar5;
      for (local_194 = 0; local_194 < 4; local_194 = local_194 + 1) {
        in_ZMM0 = *(undefined1 (*) [64])(prVar3 + iVar4 * iVar1 + (ulong)local_194 * 0x10);
        *(undefined1 (*) [64])(local_180 + (ulong)local_194 * 8) = in_ZMM0;
      }
      auVar11 = ZEXT1664(in_ZMM0._0_16_);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_188);
      while( true ) {
        std::vector<int,_std::allocator<int>_>::cend(in_stack_fffffffffffffd80);
        bVar2 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffd88,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffffd80);
        auVar10 = auVar11._0_16_;
        if (!bVar2) break;
        in_stack_fffffffffffffdd8 = DenseMatrix::data((DenseMatrix *)0x1a52cc);
        in_stack_fffffffffffffdd0 = DenseMatrix::cols(local_68);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator*(&local_188);
        for (local_1a4 = 0; local_1a4 < 4; local_1a4 = local_1a4 + 1) {
          auVar11 = *(undefined1 (*) [64])(local_180 + (ulong)local_1a4 * 8);
          first[2] = (float)in_stack_fffffffffffffdc0._0_4_;
          first[3] = (float)in_stack_fffffffffffffdc0._4_4_;
          first[4] = (float)in_stack_fffffffffffffdc0._8_4_;
          first[5] = (float)in_stack_fffffffffffffdc0._12_4_;
          first[0] = (float)(int)in_stack_fffffffffffffdb8;
          first[1] = (float)(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
          first[6] = (float)(int)in_stack_fffffffffffffdd0;
          first[7] = (float)(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
          first._32_8_ = in_stack_fffffffffffffdd8;
          first[10] = (float)(int)iVar4;
          first[0xb] = (float)(int)((ulong)iVar4 >> 0x20);
          first._48_8_ = prVar3;
          first[0xe] = (float)(int)in_stack_fffffffffffffdf0;
          first[0xf] = (float)(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
          second._8_8_ = in_stack_fffffffffffffd80;
          second[0] = 2.417642e-39;
          second[1] = 0.0;
          second._16_8_ = in_stack_fffffffffffffd88;
          second[6] = (float)(int)in_stack_fffffffffffffd90;
          second[7] = (float)(int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
          second._32_8_ = in_stack_fffffffffffffd98;
          second[10] = (float)in_stack_fffffffffffffda0;
          second[0xb] = in_stack_fffffffffffffda4;
          second._48_8_ = in_stack_fffffffffffffda8;
          second[0xe] = (float)in_stack_fffffffffffffdb0;
          second[0xf] = in_stack_fffffffffffffdb4;
          Add(first,second);
          *(undefined1 (*) [64])(local_180 + (ulong)local_1a4 * 8) = auVar11;
        }
        auVar11 = ZEXT1664(auVar11._0_16_);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_188);
      }
      sVar6 = std::vector<int,_std::allocator<int>_>::size(local_60);
      vcvtusi2sd_avx512f(auVar10,sVar6);
      Set1(in_stack_fffffffffffffdb4);
      for (local_204 = 0; local_204 < 4; local_204 = local_204 + 1) {
        uVar8 = (ulong)local_204;
        pvVar9 = (vector<int,_std::allocator<int>_> *)local_180[uVar8 * 8];
        p_Var12 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  local_180[uVar8 * 8 + 1];
        uVar13 = local_180[uVar8 * 8 + 2];
        pvVar14 = (vector<int,_std::allocator<int>_> *)local_180[uVar8 * 8 + 3];
        uVar15 = local_180[uVar8 * 8 + 4];
        pVVar16 = (Vector *)local_180[uVar8 * 8 + 5];
        uVar17 = local_180[uVar8 * 8 + 6];
        uVar18 = local_180[uVar8 * 8 + 7];
        first_00[2] = (float)in_stack_fffffffffffffdc0._0_4_;
        first_00[3] = (float)in_stack_fffffffffffffdc0._4_4_;
        first_00[4] = (float)in_stack_fffffffffffffdc0._8_4_;
        first_00[5] = (float)in_stack_fffffffffffffdc0._12_4_;
        first_00[0] = (float)(int)in_stack_fffffffffffffdb8;
        first_00[1] = (float)(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
        first_00[6] = (float)(int)in_stack_fffffffffffffdd0;
        first_00[7] = (float)(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
        first_00._32_8_ = in_stack_fffffffffffffdd8;
        first_00[10] = (float)(int)iVar4;
        first_00[0xb] = (float)(int)((ulong)iVar4 >> 0x20);
        first_00._48_8_ = prVar3;
        first_00[0xe] = (float)(int)in_stack_fffffffffffffdf0;
        first_00[0xf] = (float)(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
        second_00._8_8_ = in_stack_fffffffffffffd80;
        second_00[0] = 2.417887e-39;
        second_00[1] = 0.0;
        second_00._16_8_ = in_stack_fffffffffffffd88;
        second_00[6] = (float)(int)in_stack_fffffffffffffd90;
        second_00[7] = (float)(int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
        second_00._32_8_ = in_stack_fffffffffffffd98;
        second_00[10] = (float)in_stack_fffffffffffffda0;
        second_00[0xb] = in_stack_fffffffffffffda4;
        second_00._48_8_ = in_stack_fffffffffffffda8;
        second_00[0xe] = (float)in_stack_fffffffffffffdb0;
        second_00[0xf] = in_stack_fffffffffffffdb4;
        Multiply(first_00,second_00);
        in_stack_fffffffffffffda0 = (undefined4)uVar15;
        in_stack_fffffffffffffda4 = (real)((ulong)uVar15 >> 0x20);
        in_stack_fffffffffffffdb0 = (undefined4)uVar17;
        in_stack_fffffffffffffdb4 = (float)((ulong)uVar17 >> 0x20);
        prVar7 = Vector::data((Vector *)0x1a542d);
        prVar7 = prVar7 + (ulong)local_204 * 0x10;
        *(vector<int,_std::allocator<int>_> **)prVar7 = pvVar9;
        *(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> **)(prVar7 + 2) =
             p_Var12;
        *(undefined8 *)(prVar7 + 4) = uVar13;
        *(vector<int,_std::allocator<int>_> **)(prVar7 + 6) = pvVar14;
        *(ulong *)(prVar7 + 8) = CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
        *(Vector **)(prVar7 + 10) = pVVar16;
        *(ulong *)(prVar7 + 0xc) = CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0);
        *(undefined8 *)(prVar7 + 0xe) = uVar18;
        in_stack_fffffffffffffd80 = pvVar9;
        in_stack_fffffffffffffd88 = p_Var12;
        in_stack_fffffffffffffd90 = uVar13;
        in_stack_fffffffffffffd98 = pvVar14;
        in_stack_fffffffffffffda8 = pVVar16;
        in_stack_fffffffffffffdb8 = uVar18;
      }
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0xb4,
                "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 64U]"
               );
}

Assistant:

void averageRowsFast(Vector& x, const std::vector<int32_t>& rows, const DenseMatrix &matrix) {
  // Columns must be a multiple of how many floats fit in a register.
  static_assert(Cols % (sizeof(Register) / 4) == 0);
  constexpr unsigned RegisterCount = Cols / (sizeof(Register) / 4);
  // These should be aligned by aligned.h
  assert(reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0);
  assert(reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0);

  // Guard against empty list of rows with default NaN behavior.
  if (rows.empty()) {
    x.zero();
    x.mul(1.0 / rows.size());
    return;
  }

  // Copy the first row to accumulation registers.
  Register accum[RegisterCount];
  auto row = rows.cbegin();
  const Register *base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
  for (unsigned i = 0; i < RegisterCount; ++i) {
    accum[i] = base[i];
  }
  // Add the rows after the first.
  for (++row; row != rows.cend(); ++row) {
    base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
    for (unsigned i = 0; i < RegisterCount; ++i) {
      accum[i] = Add(accum[i], base[i]);
    }
  }
  // Multiply by (1.0 / rows.size()) and write to x.
  Register mul = Set1(1.0 / rows.size());
  for (unsigned i = 0; i < RegisterCount; ++i) {
    reinterpret_cast<Register*>(x.data())[i] = Multiply(accum[i], mul);
  }
}